

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

BufferOrError * __thiscall
slang::SourceManager::openCached
          (BufferOrError *__return_storage_ptr__,SourceManager *this,path *fullPath,
          SourceLocation includedFrom,SourceLibrary *library,uint64_t sortKey)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  SourceLocation SVar4;
  error_category *peVar5;
  uint uVar6;
  __type_conflict1 _Var7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint64_t uVar12;
  value_type_pointer __rhs;
  SourceManager *pSVar13;
  uint64_t uVar14;
  SourceLocation SVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  byte bVar36;
  error_code eVar37;
  string pathStr;
  unique_lock<std::shared_mutex> lock;
  path absPath;
  unique_lock<std::shared_mutex> lock_1;
  SmallVector<char,_40UL> buffer;
  unique_lock<std::shared_mutex> *in_stack_fffffffffffffe58;
  try_emplace_args_t local_189;
  SourceManager *local_188;
  BufferOrError *local_180;
  SourceLocation local_178;
  uint64_t local_170;
  uint64_t local_168;
  SourceManager *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined8 local_138;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  byte bStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  byte bStack_129;
  SourceBuffer local_128;
  undefined8 local_108;
  uchar uStack_100;
  uchar uStack_ff;
  uchar uStack_fe;
  byte bStack_fd;
  uchar uStack_fc;
  uchar uStack_fb;
  uchar uStack_fa;
  byte bStack_f9;
  ulong local_f0;
  pair<std::nullptr_t,_std::error_code> local_e8;
  path local_d0;
  unique_lock<std::shared_mutex> local_a8;
  undefined1 local_98 [24];
  char acStack_80 [40];
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_170 = sortKey;
  std::filesystem::__cxx11::path::path(&local_d0);
  if (this->disableProximatePaths == false) {
    local_158._M_dataplus._M_p._0_4_ = 0;
    local_158._M_string_length = std::_V2::system_category();
    std::filesystem::weakly_canonical((path *)local_98,(error_code *)fullPath);
    std::filesystem::__cxx11::path::operator=(&local_d0,(path *)local_98);
    std::filesystem::__cxx11::path::~path((path *)local_98);
    if ((int)local_158._M_dataplus._M_p != 0) {
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .m_has_value = false;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_error._M_value = (int)local_158._M_dataplus._M_p;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_value.data._M_str = (char *)local_158._M_string_length;
      goto LAB_002e07e4;
    }
  }
  else {
    std::filesystem::__cxx11::path::operator=(&local_d0,fullPath);
  }
  std::__cxx11::string::string((string *)&local_158,&local_d0._M_pathname);
  local_178 = includedFrom;
  local_138 = library;
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)&local_128,&this->mutex);
  pSVar13 = (SourceManager *)&this->lookupCache;
  uVar12 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                         *)pSVar13,&local_158);
  uVar16 = uVar12 >> ((byte)(this->lookupCache).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar17 = (uVar12 & 0xff) * 4;
  uVar21 = (&UNK_0049e39c)[lVar17];
  uVar22 = (&UNK_0049e39d)[lVar17];
  uVar23 = (&UNK_0049e39e)[lVar17];
  bVar24 = (&UNK_0049e39f)[lVar17];
  uVar14 = 0;
  uVar25 = uVar21;
  uVar26 = uVar22;
  uVar27 = uVar23;
  bVar28 = bVar24;
  uVar29 = uVar21;
  uVar30 = uVar22;
  uVar31 = uVar23;
  bVar32 = bVar24;
  uVar33 = uVar21;
  uVar34 = uVar22;
  uVar35 = uVar23;
  bVar36 = bVar24;
  do {
    pgVar2 = (this->lookupCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar16;
    local_48 = pgVar1->m[0].n;
    uStack_47 = pgVar1->m[1].n;
    uStack_46 = pgVar1->m[2].n;
    bStack_45 = pgVar1->m[3].n;
    uStack_44 = pgVar1->m[4].n;
    uStack_43 = pgVar1->m[5].n;
    uStack_42 = pgVar1->m[6].n;
    bStack_41 = pgVar1->m[7].n;
    uStack_40 = pgVar1->m[8].n;
    uStack_3f = pgVar1->m[9].n;
    uStack_3e = pgVar1->m[10].n;
    bStack_3d = pgVar1->m[0xb].n;
    uStack_3c = pgVar1->m[0xc].n;
    uStack_3b = pgVar1->m[0xd].n;
    uStack_3a = pgVar1->m[0xe].n;
    bVar8 = pgVar1->m[0xf].n;
    auVar19[0] = -(local_48 == uVar21);
    auVar19[1] = -(uStack_47 == uVar22);
    auVar19[2] = -(uStack_46 == uVar23);
    auVar19[3] = -(bStack_45 == bVar24);
    auVar19[4] = -(uStack_44 == uVar25);
    auVar19[5] = -(uStack_43 == uVar26);
    auVar19[6] = -(uStack_42 == uVar27);
    auVar19[7] = -(bStack_41 == bVar28);
    auVar19[8] = -(uStack_40 == uVar29);
    auVar19[9] = -(uStack_3f == uVar30);
    auVar19[10] = -(uStack_3e == uVar31);
    auVar19[0xb] = -(bStack_3d == bVar32);
    auVar19[0xc] = -(uStack_3c == uVar33);
    auVar19[0xd] = -(uStack_3b == uVar34);
    auVar19[0xe] = -(uStack_3a == uVar35);
    auVar19[0xf] = -(bVar8 == bVar36);
    uVar9 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
    bStack_39 = bVar8;
    if (uVar9 != 0) {
      local_108 = CONCAT17(bVar28,CONCAT16(uVar27,CONCAT15(uVar26,CONCAT14(uVar25,CONCAT13(bVar24,
                                                  CONCAT12(uVar23,CONCAT11(uVar22,uVar21)))))));
      ppVar3 = (this->lookupCache).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
               .arrays.elements_;
      local_188 = this;
      local_180 = __return_storage_ptr__;
      local_168 = uVar14;
      local_160 = pSVar13;
      uStack_100 = uVar29;
      uStack_ff = uVar30;
      uStack_fe = uVar31;
      bStack_fd = bVar32;
      uStack_fc = uVar33;
      uStack_fb = uVar34;
      uStack_fa = uVar35;
      bStack_f9 = bVar36;
      local_f0 = uVar16;
      do {
        uVar11 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        __rhs = ppVar3 + uVar16 * 0xf + (ulong)uVar11;
        _Var7 = std::operator==(&local_158,&__rhs->first);
        if (_Var7) {
          iVar10 = (__rhs->second).second._M_value;
          if (iVar10 == 0) {
            createBufferEntry((SourceBuffer *)local_98,local_188,
                              (__rhs->second).first._M_t.
                              super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                              .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>.
                              _M_head_impl,local_178,local_138,local_170,in_stack_fffffffffffffe58);
            (local_180->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
            m_has_value = true;
            (local_180->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
            field_0.m_value.data._M_len = local_98._0_8_;
            (local_180->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
            field_0.m_value.data._M_str = (char *)local_98._8_8_;
            (local_180->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
            field_0.m_value.library = (SourceLibrary *)local_98._16_8_;
            *(undefined8 *)
             ((long)&(local_180->contained).
                     super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0 + 0x18) =
                 acStack_80._0_8_;
          }
          else {
            peVar5 = (__rhs->second).second._M_cat;
            (local_180->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
            m_has_value = false;
            (local_180->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
            field_0.m_error._M_value = iVar10;
            (local_180->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
            field_0.m_value.data._M_str = (char *)peVar5;
          }
          __return_storage_ptr__ = local_180;
          std::unique_lock<std::shared_mutex>::~unique_lock
                    ((unique_lock<std::shared_mutex> *)&local_128);
          goto LAB_002e07da;
        }
        uVar9 = uVar9 - 1 & uVar9;
      } while (uVar9 != 0);
      bVar8 = pgVar2[uVar16].m[0xf].n;
      __return_storage_ptr__ = local_180;
      pSVar13 = local_160;
      uVar14 = local_168;
      uVar16 = local_f0;
      this = local_188;
      uVar21 = (uchar)local_108;
      uVar22 = local_108._1_1_;
      uVar23 = local_108._2_1_;
      bVar24 = local_108._3_1_;
      uVar25 = local_108._4_1_;
      uVar26 = local_108._5_1_;
      uVar27 = local_108._6_1_;
      bVar28 = local_108._7_1_;
      uVar29 = uStack_100;
      uVar30 = uStack_ff;
      uVar31 = uStack_fe;
      bVar32 = bStack_fd;
      uVar33 = uStack_fc;
      uVar34 = uStack_fb;
      uVar35 = uStack_fa;
      bVar36 = bStack_f9;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & bVar8) == 0) break;
    uVar18 = (this->lookupCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
             .arrays.groups_size_mask;
    lVar17 = uVar16 + uVar14;
    uVar14 = uVar14 + 1;
    uVar16 = lVar17 + 1U & uVar18;
  } while (uVar14 <= uVar18);
  std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)&local_128);
  local_98._0_8_ = acStack_80;
  local_98._8_8_ = (char *)0x0;
  local_98._16_8_ = (SourceLibrary *)0x28;
  eVar37 = OS::readFile(&local_d0,(SmallVector<char,_40UL> *)local_98);
  local_188 = (SourceManager *)eVar37._M_cat;
  iVar10 = eVar37._M_value;
  if (iVar10 == 0) {
    cacheBuffer(&local_128,this,&local_d0,&local_158,local_178,local_138,local_170,
                (SmallVector<char,_40UL> *)local_98);
    (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
    m_has_value = true;
    (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
    field_0.m_value.data._M_len = local_128.data._M_len;
    (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
    field_0.m_value.data._M_str = local_128.data._M_str;
    (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
    field_0.m_value.library = local_128.library;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0 + 0x18) =
         local_128._24_8_;
  }
  else {
    std::unique_lock<std::shared_mutex>::unique_lock(&local_a8,&this->mutex);
    local_e8.first = (void *)0x0;
    local_170 = CONCAT44(local_170._4_4_,iVar10);
    local_e8.second._M_cat = (error_category *)local_188;
    local_180 = __return_storage_ptr__;
    local_e8.second._M_value = iVar10;
    uVar14 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)pSVar13,&local_158);
    uVar18 = uVar14 >> ((pSVar13->mutex)._M_impl._M_rwlock.__size[0] & 0x3fU);
    lVar17 = (uVar14 & 0xff) * 4;
    uVar21 = (&UNK_0049e39c)[lVar17];
    uVar22 = (&UNK_0049e39d)[lVar17];
    uVar23 = (&UNK_0049e39e)[lVar17];
    bVar24 = (&UNK_0049e39f)[lVar17];
    uVar9 = (uint)uVar14;
    SVar15 = (SourceLocation)0x0;
    uVar16 = uVar18;
    uVar25 = uVar21;
    uVar26 = uVar22;
    uVar27 = uVar23;
    bVar28 = bVar24;
    uVar29 = uVar21;
    uVar30 = uVar22;
    uVar31 = uVar23;
    bVar32 = bVar24;
    uVar33 = uVar21;
    uVar34 = uVar22;
    uVar35 = uVar23;
    bVar36 = bVar24;
    local_160 = pSVar13;
    do {
      pgVar2 = (this->lookupCache).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
               .arrays.groups_;
      pgVar1 = pgVar2 + uVar16;
      local_58 = pgVar1->m[0].n;
      uStack_57 = pgVar1->m[1].n;
      uStack_56 = pgVar1->m[2].n;
      bStack_55 = pgVar1->m[3].n;
      uStack_54 = pgVar1->m[4].n;
      uStack_53 = pgVar1->m[5].n;
      uStack_52 = pgVar1->m[6].n;
      bStack_51 = pgVar1->m[7].n;
      uStack_50 = pgVar1->m[8].n;
      uStack_4f = pgVar1->m[9].n;
      uStack_4e = pgVar1->m[10].n;
      bStack_4d = pgVar1->m[0xb].n;
      uStack_4c = pgVar1->m[0xc].n;
      uStack_4b = pgVar1->m[0xd].n;
      uStack_4a = pgVar1->m[0xe].n;
      bVar8 = pgVar1->m[0xf].n;
      auVar20[0] = -(local_58 == uVar21);
      auVar20[1] = -(uStack_57 == uVar22);
      auVar20[2] = -(uStack_56 == uVar23);
      auVar20[3] = -(bStack_55 == bVar24);
      auVar20[4] = -(uStack_54 == uVar25);
      auVar20[5] = -(uStack_53 == uVar26);
      auVar20[6] = -(uStack_52 == uVar27);
      auVar20[7] = -(bStack_51 == bVar28);
      auVar20[8] = -(uStack_50 == uVar29);
      auVar20[9] = -(uStack_4f == uVar30);
      auVar20[10] = -(uStack_4e == uVar31);
      auVar20[0xb] = -(bStack_4d == bVar32);
      auVar20[0xc] = -(uStack_4c == uVar33);
      auVar20[0xd] = -(uStack_4b == uVar34);
      auVar20[0xe] = -(uStack_4a == uVar35);
      auVar20[0xf] = -(bVar8 == bVar36);
      uVar11 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
      bStack_49 = bVar8;
      if (uVar11 != 0) {
        local_138 = (SourceLibrary *)
                    CONCAT17(bVar28,CONCAT16(uVar27,CONCAT15(uVar26,CONCAT14(uVar25,CONCAT13(bVar24,
                                                  CONCAT12(uVar23,CONCAT11(uVar22,uVar21)))))));
        ppVar3 = (this->lookupCache).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                 .arrays.elements_;
        local_178 = SVar15;
        local_168 = uVar14;
        uStack_130 = uVar29;
        uStack_12f = uVar30;
        uStack_12e = uVar31;
        bStack_12d = bVar32;
        uStack_12c = uVar33;
        uStack_12b = uVar34;
        uStack_12a = uVar35;
        bStack_129 = bVar36;
        local_108 = uVar16;
        do {
          uVar6 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          pSVar13 = (SourceManager *)(ppVar3 + uVar16 * 0xf + (ulong)uVar6);
          _Var7 = std::operator==(&local_158,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)pSVar13);
          if (_Var7) goto LAB_002e06db;
          uVar11 = uVar11 - 1 & uVar11;
        } while (uVar11 != 0);
        bVar8 = pgVar2[uVar16].m[0xf].n;
        uVar14 = local_168;
        SVar15 = local_178;
        uVar16 = local_108;
        uVar21 = (uchar)local_138;
        uVar22 = local_138._1_1_;
        uVar23 = local_138._2_1_;
        bVar24 = local_138._3_1_;
        uVar25 = local_138._4_1_;
        uVar26 = local_138._5_1_;
        uVar27 = local_138._6_1_;
        bVar28 = local_138._7_1_;
        uVar29 = uStack_130;
        uVar30 = uStack_12f;
        uVar31 = uStack_12e;
        bVar32 = bStack_12d;
        uVar33 = uStack_12c;
        uVar34 = uStack_12b;
        uVar35 = uStack_12a;
        bVar36 = bStack_129;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar9 & 7] & bVar8) == 0) break;
      SVar4 = (SourceLocation)
              (this->lookupCache).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
              .arrays.groups_size_mask;
      lVar17 = uVar16 + (long)SVar15;
      SVar15 = (SourceLocation)((long)SVar15 + 1);
      uVar16 = lVar17 + 1U & (ulong)SVar4;
    } while ((ulong)SVar15 <= (ulong)SVar4);
    pSVar13 = local_160;
    if ((this->lookupCache).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
        .size_ctrl.size <
        (this->lookupCache).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<decltype(nullptr),std::error_code>>
                ((locator *)&local_128,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
                  *)local_160,uVar18,uVar14,&local_189,&local_158,&local_e8);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<decltype(nullptr),std::error_code>>
                ((locator *)&local_128,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
                  *)local_160,uVar14,&local_189,&local_158,&local_e8);
    }
LAB_002e06db:
    __return_storage_ptr__ = local_180;
    (local_180->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value =
         false;
    (local_180->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
    m_error._M_value = (int)local_170;
    (local_180->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
    m_value.data._M_str = (char *)local_188;
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_a8);
    this = pSVar13;
  }
  SmallVectorBase<char>::cleanup((SmallVectorBase<char> *)local_98,(EVP_PKEY_CTX *)this);
LAB_002e07da:
  std::__cxx11::string::~string((string *)&local_158);
LAB_002e07e4:
  std::filesystem::__cxx11::path::~path(&local_d0);
  return __return_storage_ptr__;
}

Assistant:

SourceManager::BufferOrError SourceManager::openCached(const fs::path& fullPath,
                                                       SourceLocation includedFrom,
                                                       const SourceLibrary* library,
                                                       uint64_t sortKey) {
    fs::path absPath;
    if (!disableProximatePaths) {
        std::error_code ec;
        absPath = fs::weakly_canonical(fullPath, ec);
        if (ec)
            return nonstd::make_unexpected(ec);
    }
    else {
        absPath = fullPath;
    }

    // first see if we have this file cached
    std::string pathStr = getU8Str(absPath);
    {
        std::unique_lock<std::shared_mutex> lock(mutex);
        auto it = lookupCache.find(pathStr);
        if (it != lookupCache.end()) {
            auto& [fd, ec] = it->second;
            if (ec)
                return nonstd::make_unexpected(ec);

            SLANG_ASSERT(fd);
            return createBufferEntry(fd.get(), includedFrom, library, sortKey, lock);
        }
    }

    // do the read
    SmallVector<char> buffer;
    if (std::error_code ec = OS::readFile(absPath, buffer)) {
        std::unique_lock<std::shared_mutex> lock(mutex);
        lookupCache.emplace(pathStr, std::pair{nullptr, ec});
        return nonstd::make_unexpected(ec);
    }

    return cacheBuffer(std::move(absPath), std::move(pathStr), includedFrom, library, sortKey,
                       std::move(buffer));
}